

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<char_const(&)[10],capnp::Text::Reader,kj::StringPtr&,char_const*>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [10],Reader *params_1,
          StringPtr *params_2,char **params_3)

{
  char (*value) [10];
  Reader *value_00;
  StringPtr *value_01;
  char **value_02;
  ArrayPtr<const_char> local_70;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  StringPtr *local_30;
  char **params_local_3;
  StringPtr *params_local_2;
  Reader *params_local_1;
  char (*params_local) [10];
  
  local_30 = params_2;
  params_local_3 = (char **)params_1;
  params_local_2 = (StringPtr *)params;
  params_local_1 = (Reader *)this;
  params_local = (char (*) [10])__return_storage_ptr__;
  value = ::const((char (*) [10])this);
  local_40 = _::toStringTreeOrCharSequence<char_const(&)[10]>(value);
  value_00 = fwd<capnp::Text::Reader>((NoInfer<capnp::Text::Reader> *)params_local_2);
  local_50 = _::toStringTreeOrCharSequence<capnp::Text::Reader>(value_00);
  value_01 = fwd<kj::StringPtr&>((StringPtr *)params_local_3);
  local_60 = _::toStringTreeOrCharSequence<kj::StringPtr&>(value_01);
  value_02 = fwd<char_const*>((NoInfer<const_char_*> *)local_30);
  local_70 = _::toStringTreeOrCharSequence<char_const*>(value_02);
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_40,&local_50,&local_60,&local_70,
             (ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}